

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  uint uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (uint)flags->lower;
  if ((uVar2 >> 0xe & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((short)uVar2 < 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = (uint)flags->lower;
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  bVar1 = Bitset::get(flags,4999);
  if (bVar1) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant))
		res += "invariant ";
	if (flags.get(DecorationExplicitInterpAMD))
		res += "__explicitInterpAMD ";

	return res;
}